

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# truc_policy.cpp
# Opt level: O1

optional<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>_>
* SingleTRUCChecks_abi_cxx11_
            (optional<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>_>
             *__return_storage_ptr__,CTransactionRef *ptx,setEntries *mempool_ancestors,
            set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
            *direct_conflicts,int64_t vsize)

{
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  uint32_t uVar3;
  element_type *peVar4;
  size_t sVar5;
  long lVar6;
  long lVar7;
  undefined8 *puVar8;
  size_type sVar9;
  _Base_ptr p_Var10;
  pointer pcVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  size_type sVar13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var14;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var15;
  long in_FS_OFFSET;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar19;
  undefined1 local_110 [16];
  undefined1 local_100 [16];
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  p_Var10 = (mempool_ancestors->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(mempool_ancestors->_M_t)._M_impl.super__Rb_tree_header;
  bVar17 = (_Rb_tree_header *)p_Var10 == p_Var1;
  local_110._0_8_ = vsize;
  if (!bVar17) {
    peVar4 = (ptx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    uVar3 = peVar4->version;
    do {
      if (uVar3 == 3) {
LAB_0099436a:
        if (*(int *)(**(long **)(p_Var10 + 1) + 0x30) != 3) {
          base_blob<256u>::ToString_abi_cxx11_(&local_78,&peVar4->hash);
          base_blob<256u>::ToString_abi_cxx11_
                    (&local_98,
                     &((ptx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr)->m_witness_hash);
          lVar6 = **(long **)(p_Var10 + 1);
          p_Var15 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(*(long **)(p_Var10 + 1))[1];
          if (p_Var15 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var15->_M_use_count = p_Var15->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var15->_M_use_count = p_Var15->_M_use_count + 1;
            }
          }
          pbVar19 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    __return_storage_ptr__;
          base_blob<256u>::ToString_abi_cxx11_(&local_b8,(void *)(lVar6 + 0x39));
          lVar6 = **(long **)(p_Var10 + 1);
          p_Var14 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(*(long **)(p_Var10 + 1))[1];
          if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
            }
          }
          base_blob<256u>::ToString_abi_cxx11_(&local_d8,(void *)(lVar6 + 0x59));
          vsize = (int64_t)&local_b8;
          tinyformat::
          format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                    (&local_58,
                     (tinyformat *)
                     "version=3 tx %s (wtxid=%s) cannot spend from non-version=3 tx %s (wtxid=%s)",
                     (char *)&local_78,&local_98,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)vsize,
                     &local_d8,pbVar19);
LAB_00994524:
          paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(local_100 + 8);
          paVar2 = &local_58.field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p == paVar2) {
            uStack_f0 = local_58.field_2._8_8_;
            local_110._8_8_ = paVar12;
          }
          else {
            local_110._8_8_ = local_58._M_dataplus._M_p;
          }
          local_100._9_7_ = local_58.field_2._M_allocated_capacity._1_7_;
          local_100[8] = local_58.field_2._M_local_buf[0];
          *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            **)&(((_Optional_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>,_false,_false>
                   *)&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      __return_storage_ptr__)->_M_dataplus)->_M_payload).
                super__Optional_payload<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>,_true,_false,_false>
                .
                super__Optional_payload_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>_>
                ._M_payload =
               &((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                __return_storage_ptr__)->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._8_8_ == paVar12) {
            (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __return_storage_ptr__)->field_2)._M_allocated_capacity = local_100._8_8_;
            *(undefined8 *)
             ((long)&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     __return_storage_ptr__)->field_2 + 8) = uStack_f0;
          }
          else {
            (((_Optional_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>,_false,_false>
               *)&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  __return_storage_ptr__)->_M_dataplus)->_M_payload).
            super__Optional_payload<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>_>
            ._M_payload._M_value.first._M_dataplus = (_Alloc_hider)local_110._8_8_;
            (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __return_storage_ptr__)->field_2)._M_allocated_capacity = local_100._8_8_;
          }
          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          __return_storage_ptr__)->_M_string_length = local_58._M_string_length;
          local_100._8_8_ = (ulong)(uint7)local_58.field_2._M_allocated_capacity._1_7_ << 8;
          (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ((long)__return_storage_ptr__ + 0x20))->_M_dataplus)._M_p = (pointer)0x0;
          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          ((long)__return_storage_ptr__ + 0x20))->_M_string_length = 0;
          (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ((long)__return_storage_ptr__ + 0x20))->field_2)._M_local_buf[0] = true;
          local_58.field_2._M_local_buf[0] = '\0';
          local_58._M_string_length = 0;
          local_e8 = 0;
          local_100._0_8_ = 0;
          __return_storage_ptr__ =
               (optional<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>_>
                *)pbVar19;
          local_110._8_8_ = paVar12;
          local_58._M_dataplus._M_p = (pointer)paVar2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
            operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
            __return_storage_ptr__ =
                 (optional<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>_>
                  *)pbVar19;
          }
          if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var14);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
            operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
          }
          if (p_Var15 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var15);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
          }
          if (!bVar17) goto LAB_00994b8f;
          break;
        }
      }
      else {
        if (*(int *)(**(long **)(p_Var10 + 1) + 0x30) == 3) {
          base_blob<256u>::ToString_abi_cxx11_(&local_78,&peVar4->hash);
          base_blob<256u>::ToString_abi_cxx11_
                    (&local_98,
                     &((ptx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr)->m_witness_hash);
          lVar6 = **(long **)(p_Var10 + 1);
          p_Var15 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(*(long **)(p_Var10 + 1))[1];
          if (p_Var15 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var15->_M_use_count = p_Var15->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var15->_M_use_count = p_Var15->_M_use_count + 1;
            }
          }
          pbVar19 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    __return_storage_ptr__;
          base_blob<256u>::ToString_abi_cxx11_(&local_b8,(void *)(lVar6 + 0x39));
          lVar6 = **(long **)(p_Var10 + 1);
          p_Var14 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(*(long **)(p_Var10 + 1))[1];
          if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
            }
          }
          base_blob<256u>::ToString_abi_cxx11_(&local_d8,(void *)(lVar6 + 0x59));
          vsize = (int64_t)&local_b8;
          tinyformat::
          format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                    (&local_58,
                     (tinyformat *)
                     "non-version=3 tx %s (wtxid=%s) cannot spend from version=3 tx %s (wtxid=%s)",
                     (char *)&local_78,&local_98,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)vsize,
                     &local_d8,pbVar19);
          goto LAB_00994524;
        }
        if (uVar3 == 3) goto LAB_0099436a;
      }
      p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
      bVar17 = (_Rb_tree_header *)p_Var10 == p_Var1;
    } while (!bVar17);
  }
  peVar4 = (ptx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (peVar4->version != 3) goto LAB_00994b87;
  if ((long)local_110._0_8_ < 0x2711) {
    sVar5 = (mempool_ancestors->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
    if (0xfffffffffffffffc < sVar5 - 2) {
      if (sVar5 != 0) {
        if (1000 < (long)local_110._0_8_) {
          base_blob<256u>::ToString_abi_cxx11_(&local_78,&peVar4->hash);
          base_blob<256u>::ToString_abi_cxx11_
                    (&local_98,
                     &((ptx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr)->m_witness_hash);
          tinyformat::format<std::__cxx11::string,std::__cxx11::string,long,long>
                    (&local_58,
                     (tinyformat *)
                     "version=3 child tx %s (wtxid=%s) is too big: %u > %u virtual bytes",
                     (char *)&local_78,&local_98,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110,
                     &TRUC_CHILD_MAX_VSIZE,(long *)__return_storage_ptr__);
          goto LAB_0099480e;
        }
        p_Var10 = (mempool_ancestors->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        lVar6 = *(long *)(p_Var10 + 1);
        if (*(long *)(lVar6 + 0x68) == 0) {
          bVar17 = false;
        }
        else {
          bVar17 = std::
                   any_of<std::_Rb_tree_const_iterator<std::reference_wrapper<CTxMemPoolEntry_const>>,SingleTRUCChecks[abi:cxx11](std::shared_ptr<CTransaction_const>const&,std::set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::index_node_base<CTxMemPoolEntry,std::allocator<CTxMemPoolEntry>>>>>>>,boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>>,boost::multi_index::detail::hashed_unique_tag,boost::multi_index::detail::hashed_index_global_iterator_tag>,CompareIteratorByHash,std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::index_node_base<CTxMemPoolEntry,std::allocator<CTxMemPoolEntry>>>>>>>,boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>>,boost::multi_index::detail::hashed_unique_tag,boost::multi_index::detail::hashed_index_global_iterator_tag>>>const&,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>const&,long)::__0>
                             (*(_Base_ptr *)(lVar6 + 0x58),(_Base_ptr)(lVar6 + 0x48),
                              (anon_class_8_1_b4982c89_for__M_pred)direct_conflicts);
        }
        bVar16 = 2 < *(long *)(*(long *)(p_Var10 + 1) + 200) + 1U;
        if (bVar16 && bVar17 == false) {
          if (*(long *)(*(long *)(p_Var10 + 1) + 200) == 2) {
            bVar18 = *(long *)(*(long *)(*(long *)(lVar6 + 0x58) + 0x20) + 0xe0) == 2;
          }
          else {
            bVar18 = false;
          }
          lVar7 = **(long **)(p_Var10 + 1);
          p_Var15 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(*(long **)(p_Var10 + 1))[1];
          if (p_Var15 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var15->_M_use_count = p_Var15->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var15->_M_use_count = p_Var15->_M_use_count + 1;
            }
          }
          pbVar19 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    __return_storage_ptr__;
          base_blob<256u>::ToString_abi_cxx11_(&local_78,(void *)(lVar7 + 0x39));
          lVar7 = **(long **)(p_Var10 + 1);
          p_Var14 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(*(long **)(p_Var10 + 1))[1];
          if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
            }
          }
          base_blob<256u>::ToString_abi_cxx11_(&local_98,(void *)(lVar7 + 0x59));
          tinyformat::format<std::__cxx11::string,std::__cxx11::string>
                    (&local_58,(tinyformat *)"tx %u (wtxid=%s) would exceed descendant count limit",
                     (char *)&local_78,&local_98,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)vsize);
          sVar9 = local_58._M_string_length;
          if (bVar18) {
            puVar8 = *(undefined8 **)(*(long *)(lVar6 + 0x58) + 0x20);
            pcVar11 = (pointer)*puVar8;
            sVar13 = puVar8[1];
            if (sVar13 != 0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(int *)(sVar13 + 8) = *(int *)(sVar13 + 8) + 1;
                UNLOCK();
              }
              else {
                *(int *)(sVar13 + 8) = *(int *)(sVar13 + 8) + 1;
              }
            }
          }
          else {
            pcVar11 = (pointer)0x0;
            sVar13 = 0;
          }
          paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(local_100 + 8);
          paVar2 = &local_58.field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p == paVar2) {
            uStack_f0 = local_58.field_2._8_8_;
            local_110._8_8_ = paVar12;
          }
          else {
            local_110._8_8_ = local_58._M_dataplus._M_p;
          }
          local_100._9_7_ = local_58.field_2._M_allocated_capacity._1_7_;
          local_100[8] = local_58.field_2._M_local_buf[0];
          local_58._M_string_length = 0;
          local_58.field_2._M_local_buf[0] = '\0';
          *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            **)&(((_Optional_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>,_false,_false>
                   *)&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      __return_storage_ptr__)->_M_dataplus)->_M_payload).
                super__Optional_payload<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>,_true,_false,_false>
                .
                super__Optional_payload_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>_>
                ._M_payload =
               &((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                __return_storage_ptr__)->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._8_8_ == paVar12) {
            (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __return_storage_ptr__)->field_2)._M_allocated_capacity = local_100._8_8_;
            *(undefined8 *)
             ((long)&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     __return_storage_ptr__)->field_2 + 8) = uStack_f0;
          }
          else {
            (((_Optional_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>,_false,_false>
               *)&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  __return_storage_ptr__)->_M_dataplus)->_M_payload).
            super__Optional_payload<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>_>
            ._M_payload._M_value.first._M_dataplus = (_Alloc_hider)local_110._8_8_;
            (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __return_storage_ptr__)->field_2)._M_allocated_capacity = local_100._8_8_;
          }
          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          __return_storage_ptr__)->_M_string_length = sVar9;
          local_100._0_8_ = 0;
          local_100._8_8_ = (ulong)(uint7)local_58.field_2._M_allocated_capacity._1_7_ << 8;
          (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ((long)__return_storage_ptr__ + 0x20))->_M_dataplus)._M_p = pcVar11;
          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          ((long)__return_storage_ptr__ + 0x20))->_M_string_length = 0;
          local_e0 = 0;
          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          ((long)__return_storage_ptr__ + 0x20))->_M_string_length = sVar13;
          local_e8 = 0;
          (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ((long)__return_storage_ptr__ + 0x20))->field_2)._M_local_buf[0] = true;
          local_110._8_8_ = paVar12;
          local_58._M_dataplus._M_p = (pointer)paVar2;
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>
          ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>
                   *)(local_110 + 8));
          __return_storage_ptr__ =
               (optional<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>_>
                *)pbVar19;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != paVar2) {
            operator_delete(local_58._M_dataplus._M_p,
                            CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                     local_58.field_2._M_local_buf[0]) + 1);
            __return_storage_ptr__ =
                 (optional<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>_>
                  *)pbVar19;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
          }
          if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var14);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
          }
          if (p_Var15 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var15);
          }
          if (bVar16 && bVar17 == false) goto LAB_00994b8f;
        }
      }
LAB_00994b87:
      (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((long)__return_storage_ptr__ + 0x20))->field_2)._M_local_buf[0] = false;
      goto LAB_00994b8f;
    }
    base_blob<256u>::ToString_abi_cxx11_(&local_78,&peVar4->hash);
    base_blob<256u>::ToString_abi_cxx11_
              (&local_98,
               &((ptx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                m_witness_hash);
    tinyformat::format<std::__cxx11::string,std::__cxx11::string>
              (&local_58,(tinyformat *)"tx %s (wtxid=%s) would have too many ancestors",
               (char *)&local_78,&local_98,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)vsize);
LAB_0099480e:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p == &local_58.field_2) goto LAB_00994830;
LAB_00994729:
    local_100._8_8_ =
         CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,local_58.field_2._M_local_buf[0]);
    local_110._8_8_ = local_58._M_dataplus._M_p;
  }
  else {
    base_blob<256u>::ToString_abi_cxx11_(&local_78,&peVar4->hash);
    base_blob<256u>::ToString_abi_cxx11_
              (&local_98,
               &((ptx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                m_witness_hash);
    tinyformat::format<std::__cxx11::string,std::__cxx11::string,long,long>
              (&local_58,
               (tinyformat *)"version=3 tx %s (wtxid=%s) is too big: %u > %u virtual bytes",
               (char *)&local_78,&local_98,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110,
               &TRUC_MAX_VSIZE,(long *)__return_storage_ptr__);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) goto LAB_00994729;
LAB_00994830:
    local_110._8_8_ = local_100 + 8;
    local_100._8_8_ =
         CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,local_58.field_2._M_local_buf[0]);
    uStack_f0 = local_58.field_2._8_8_;
  }
  paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_100 + 8);
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    **)&(((_Optional_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>,_false,_false>
           *)&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              __return_storage_ptr__)->_M_dataplus)->_M_payload).
        super__Optional_payload<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>_>
        ._M_payload =
       &((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__return_storage_ptr__
        )->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._8_8_ == paVar12) {
    (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__return_storage_ptr__)->
    field_2)._M_allocated_capacity = local_100._8_8_;
    *(undefined8 *)
     ((long)&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __return_storage_ptr__)->field_2 + 8) = uStack_f0;
  }
  else {
    (((_Optional_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>,_false,_false>
       *)&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          __return_storage_ptr__)->_M_dataplus)->_M_payload).
    super__Optional_payload<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>_>
    ._M_payload._M_value.first._M_dataplus = (_Alloc_hider)local_110._8_8_;
    (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__return_storage_ptr__)->
    field_2)._M_allocated_capacity = local_100._8_8_;
  }
  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__return_storage_ptr__)->
  _M_string_length = local_58._M_string_length;
  local_100._8_8_ = local_100._8_8_ & 0xffffffffffffff00;
  (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
   ((long)__return_storage_ptr__ + 0x20))->_M_dataplus)._M_p = (pointer)0x0;
  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
  ((long)__return_storage_ptr__ + 0x20))->_M_string_length = 0;
  (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
   ((long)__return_storage_ptr__ + 0x20))->field_2)._M_local_buf[0] = true;
  local_58.field_2._M_local_buf[0] = '\0';
  local_58._M_string_length = 0;
  local_e8 = 0;
  local_100._0_8_ = 0;
  local_110._8_8_ = paVar12;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
LAB_00994b8f:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (optional<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>_>
            *)(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<std::pair<std::string, CTransactionRef>> SingleTRUCChecks(const CTransactionRef& ptx,
                                          const CTxMemPool::setEntries& mempool_ancestors,
                                          const std::set<Txid>& direct_conflicts,
                                          int64_t vsize)
{
    // Check TRUC and non-TRUC inheritance.
    for (const auto& entry : mempool_ancestors) {
        if (ptx->version != TRUC_VERSION && entry->GetTx().version == TRUC_VERSION) {
            return std::make_pair(strprintf("non-version=3 tx %s (wtxid=%s) cannot spend from version=3 tx %s (wtxid=%s)",
                             ptx->GetHash().ToString(), ptx->GetWitnessHash().ToString(),
                             entry->GetSharedTx()->GetHash().ToString(), entry->GetSharedTx()->GetWitnessHash().ToString()),
                nullptr);
        } else if (ptx->version == TRUC_VERSION && entry->GetTx().version != TRUC_VERSION) {
            return std::make_pair(strprintf("version=3 tx %s (wtxid=%s) cannot spend from non-version=3 tx %s (wtxid=%s)",
                             ptx->GetHash().ToString(), ptx->GetWitnessHash().ToString(),
                             entry->GetSharedTx()->GetHash().ToString(), entry->GetSharedTx()->GetWitnessHash().ToString()),
                nullptr);
        }
    }

    // This function is specialized for these limits, and must be reimplemented if they ever change.
    static_assert(TRUC_ANCESTOR_LIMIT == 2);
    static_assert(TRUC_DESCENDANT_LIMIT == 2);

    // The rest of the rules only apply to transactions with version=3.
    if (ptx->version != TRUC_VERSION) return std::nullopt;

    if (vsize > TRUC_MAX_VSIZE) {
        return std::make_pair(strprintf("version=3 tx %s (wtxid=%s) is too big: %u > %u virtual bytes",
                         ptx->GetHash().ToString(), ptx->GetWitnessHash().ToString(), vsize, TRUC_MAX_VSIZE),
            nullptr);
    }

    // Check that TRUC_ANCESTOR_LIMIT would not be violated.
    if (mempool_ancestors.size() + 1 > TRUC_ANCESTOR_LIMIT) {
        return std::make_pair(strprintf("tx %s (wtxid=%s) would have too many ancestors",
                         ptx->GetHash().ToString(), ptx->GetWitnessHash().ToString()),
            nullptr);
    }

    // Remaining checks only pertain to transactions with unconfirmed ancestors.
    if (mempool_ancestors.size() > 0) {
        // If this transaction spends TRUC parents, it cannot be too large.
        if (vsize > TRUC_CHILD_MAX_VSIZE) {
            return std::make_pair(strprintf("version=3 child tx %s (wtxid=%s) is too big: %u > %u virtual bytes",
                             ptx->GetHash().ToString(), ptx->GetWitnessHash().ToString(), vsize, TRUC_CHILD_MAX_VSIZE),
                nullptr);
        }

        // Check the descendant counts of in-mempool ancestors.
        const auto& parent_entry = *mempool_ancestors.begin();
        // If there are any ancestors, this is the only child allowed. The parent cannot have any
        // other descendants. We handle the possibility of multiple children as that case is
        // possible through a reorg.
        const auto& children = parent_entry->GetMemPoolChildrenConst();
        // Don't double-count a transaction that is going to be replaced. This logic assumes that
        // any descendant of the TRUC transaction is a direct child, which makes sense because a
        // TRUC transaction can only have 1 descendant.
        const bool child_will_be_replaced = !children.empty() &&
            std::any_of(children.cbegin(), children.cend(),
                [&direct_conflicts](const CTxMemPoolEntry& child){return direct_conflicts.count(child.GetTx().GetHash()) > 0;});
        if (parent_entry->GetCountWithDescendants() + 1 > TRUC_DESCENDANT_LIMIT && !child_will_be_replaced) {
            // Allow sibling eviction for TRUC transaction: if another child already exists, even if
            // we don't conflict inputs with it, consider evicting it under RBF rules. We rely on TRUC rules
            // only permitting 1 descendant, as otherwise we would need to have logic for deciding
            // which descendant to evict. Skip if this isn't true, e.g. if the transaction has
            // multiple children or the sibling also has descendants due to a reorg.
            const bool consider_sibling_eviction{parent_entry->GetCountWithDescendants() == 2 &&
                children.begin()->get().GetCountWithAncestors() == 2};

            // Return the sibling if its eviction can be considered. Provide the "descendant count
            // limit" string either way, as the caller may decide not to do sibling eviction.
            return std::make_pair(strprintf("tx %u (wtxid=%s) would exceed descendant count limit",
                                            parent_entry->GetSharedTx()->GetHash().ToString(),
                                            parent_entry->GetSharedTx()->GetWitnessHash().ToString()),
                                  consider_sibling_eviction ?  children.begin()->get().GetSharedTx() : nullptr);
        }
    }
    return std::nullopt;
}